

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfilt.c
# Opt level: O0

_Bool write_stdout(void *buffer,size_t nbytes)

{
  int filedes;
  size_t sVar1;
  ssize_t nwrite;
  size_t nbytes_local;
  void *buffer_local;
  
  filedes = fileno(_stdout);
  sVar1 = fullwrite(filedes,buffer,nbytes);
  if (sVar1 != nbytes) {
    logmsg("exiting...");
  }
  return sVar1 == nbytes;
}

Assistant:

static bool write_stdout(const void *buffer, size_t nbytes)
{
  ssize_t nwrite = fullwrite(fileno(stdout), buffer, nbytes);
  if(nwrite != (ssize_t)nbytes) {
    logmsg("exiting...");
    return FALSE;
  }
  return TRUE;
}